

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,SubroutineSymbol *symbol)

{
  bool bVar1;
  SmallVectorBase<const_slang::ast::SubroutineSymbol_*> *this_00;
  long in_RSI;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffffc8;
  SubroutineSymbol *in_stack_ffffffffffffffe0;
  DiagnosticVisitor *in_stack_ffffffffffffffe8;
  
  bVar1 = handleDefault<slang::ast::SubroutineSymbol>
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (bVar1) {
    this_00 = (SmallVectorBase<const_slang::ast::SubroutineSymbol_*> *)(in_RSI + 0xc4);
    bitmask<slang::ast::MethodFlags>::bitmask
              ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffee,DPIImport);
    bVar1 = bitmask<slang::ast::MethodFlags>::has
                      ((bitmask<slang::ast::MethodFlags> *)this_00,in_stack_ffffffffffffffc8);
    if (bVar1) {
      SmallVectorBase<const_slang::ast::SubroutineSymbol_*>::push_back
                (this_00,(SubroutineSymbol **)in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

void handle(const SubroutineSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        if (symbol.flags.has(MethodFlags::DPIImport))
            dpiImports.push_back(&symbol);
    }